

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_x_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  CONV_BUF_TYPE *pCVar5;
  int16_t *piVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ushort uVar12;
  char cVar13;
  undefined1 auVar14 [32];
  undefined2 uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  undefined2 uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  uint16_t *puVar23;
  CONV_BUF_TYPE *pCVar24;
  CONV_BUF_TYPE *pCVar25;
  int iVar26;
  long lVar27;
  uint16_t *puVar28;
  uint uVar29;
  uint16_t *puVar30;
  int iVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  
  iVar26 = conv_params->round_0 + conv_params->round_1;
  cVar13 = (char)bd - (char)iVar26;
  uVar19 = 0xff;
  if (bd == 0xc) {
    uVar19 = 0xfff;
  }
  uVar15 = 0x3ff;
  if (bd != 10) {
    uVar15 = uVar19;
  }
  if (0 < w) {
    uVar29 = 7 - conv_params->round_1;
    pCVar5 = conv_params->dst;
    iVar31 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    uVar21 = (ulong)((subpel_x_qn & 0xfU) * (uint)filter_params_x->taps);
    uVar12 = filter_params_x->taps >> 1;
    iVar1 = conv_params->fwd_offset;
    iVar2 = conv_params->bck_offset;
    auVar35._4_4_ = iVar31;
    auVar35._0_4_ = iVar31;
    auVar35._8_4_ = iVar31;
    auVar35._12_4_ = iVar31;
    auVar35._16_4_ = iVar31;
    auVar35._20_4_ = iVar31;
    auVar35._24_4_ = iVar31;
    auVar35._28_4_ = iVar31;
    uVar4 = conv_params->round_0;
    iVar31 = (1 << (cVar13 + 0xdU & 0x1f)) + (1 << (cVar13 + 0xeU & 0x1f));
    auVar36._4_4_ = iVar31;
    auVar36._0_4_ = iVar31;
    auVar36._8_4_ = iVar31;
    auVar36._12_4_ = iVar31;
    auVar36._16_4_ = iVar31;
    auVar36._20_4_ = iVar31;
    auVar36._24_4_ = iVar31;
    auVar36._28_4_ = iVar31;
    uVar17 = 0xe - iVar26;
    auVar37._2_2_ = uVar15;
    auVar37._0_2_ = uVar15;
    auVar37._4_2_ = uVar15;
    auVar37._6_2_ = uVar15;
    auVar37._8_2_ = uVar15;
    auVar37._10_2_ = uVar15;
    auVar37._12_2_ = uVar15;
    auVar37._14_2_ = uVar15;
    auVar37._16_2_ = uVar15;
    auVar37._18_2_ = uVar15;
    auVar37._20_2_ = uVar15;
    auVar37._22_2_ = uVar15;
    auVar37._24_2_ = uVar15;
    auVar37._26_2_ = uVar15;
    auVar37._28_2_ = uVar15;
    auVar37._30_2_ = uVar15;
    piVar6 = filter_params_x->filter_ptr;
    uVar3 = *(undefined4 *)(piVar6 + uVar21 + 6);
    auVar38._4_4_ = uVar3;
    auVar38._0_4_ = uVar3;
    auVar38._8_4_ = uVar3;
    auVar38._12_4_ = uVar3;
    auVar38._16_4_ = uVar3;
    auVar38._20_4_ = uVar3;
    auVar38._24_4_ = uVar3;
    auVar38._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar6 + uVar21 + 4);
    auVar39._4_4_ = uVar3;
    auVar39._0_4_ = uVar3;
    auVar39._8_4_ = uVar3;
    auVar39._12_4_ = uVar3;
    auVar39._16_4_ = uVar3;
    auVar39._20_4_ = uVar3;
    auVar39._24_4_ = uVar3;
    auVar39._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar6 + uVar21 + 2);
    auVar40._4_4_ = uVar3;
    auVar40._0_4_ = uVar3;
    auVar40._8_4_ = uVar3;
    auVar40._12_4_ = uVar3;
    auVar40._16_4_ = uVar3;
    auVar40._20_4_ = uVar3;
    auVar40._24_4_ = uVar3;
    auVar40._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar6 + uVar21);
    auVar41._4_4_ = uVar3;
    auVar41._0_4_ = uVar3;
    auVar41._8_4_ = uVar3;
    auVar41._12_4_ = uVar3;
    auVar41._16_4_ = uVar3;
    auVar41._20_4_ = uVar3;
    auVar41._24_4_ = uVar3;
    auVar41._28_4_ = uVar3;
    lVar27 = (long)conv_params->dst_stride;
    iVar26 = (1 << ((byte)uVar17 & 0x1f)) >> 1;
    auVar42._4_4_ = iVar26;
    auVar42._0_4_ = iVar26;
    auVar42._8_4_ = iVar26;
    auVar42._12_4_ = iVar26;
    auVar42._16_4_ = iVar26;
    auVar42._20_4_ = iVar26;
    auVar42._24_4_ = iVar26;
    auVar42._28_4_ = iVar26;
    iVar26 = conv_params->do_average;
    iVar31 = conv_params->use_dist_wtd_comp_avg;
    auVar42 = vpsubd_avx2(auVar42,auVar36);
    lVar16 = (long)dst_stride0;
    lVar22 = (long)src_stride;
    lVar20 = 0;
    uVar21 = 0;
    do {
      if (0 < h) {
        lVar18 = 0;
        puVar23 = dst0 + lVar16;
        pCVar24 = pCVar5;
        pCVar25 = pCVar5 + lVar27;
        puVar28 = dst0;
        puVar30 = src + (1 - (ulong)uVar12);
        lVar32 = (long)src + (lVar22 * 2 - (ulong)((uint)uVar12 * 2)) + 2;
        do {
          auVar10 = vperm2i128_avx2(*(undefined1 (*) [32])((long)puVar30 + lVar20),
                                    *(undefined1 (*) [32])(lVar32 + lVar20),0x20);
          auVar11 = vperm2i128_avx2(*(undefined1 (*) [32])((long)puVar30 + lVar20),
                                    *(undefined1 (*) [32])(lVar32 + lVar20),0x31);
          auVar43 = vpalignr_avx2(auVar11,auVar10,4);
          auVar44 = vpalignr_avx2(auVar11,auVar10,8);
          auVar7 = vpalignr_avx2(auVar11,auVar10,0xc);
          auVar45 = vpmaddwd_avx2(auVar10,auVar41);
          auVar8 = vpmaddwd_avx2(auVar43,auVar40);
          auVar43 = vpmaddwd_avx2(auVar44,auVar39);
          auVar44 = vpmaddwd_avx2(auVar7,auVar38);
          auVar43 = vpaddd_avx2(auVar43,auVar44);
          auVar44 = vpaddd_avx2(auVar45,auVar35);
          auVar44 = vpaddd_avx2(auVar8,auVar44);
          auVar43 = vpaddd_avx2(auVar44,auVar43);
          auVar9 = vpsrad_avx2(auVar43,ZEXT416(uVar4));
          auVar43 = vpalignr_avx2(auVar11,auVar10,2);
          auVar44 = vpalignr_avx2(auVar11,auVar10,6);
          auVar7 = vpalignr_avx2(auVar11,auVar10,10);
          auVar45 = vpalignr_avx2(auVar11,auVar10,0xe);
          auVar8 = vpmaddwd_avx2(auVar41,auVar43);
          auVar43 = vpmaddwd_avx2(auVar44,auVar40);
          auVar44 = vpmaddwd_avx2(auVar7,auVar39);
          auVar43 = vpaddd_avx2(auVar43,auVar44);
          auVar7 = vpmaddwd_avx2(auVar45,auVar38);
          auVar44 = vpaddd_avx2(auVar8,auVar35);
          auVar43 = vpaddd_avx2(auVar43,auVar44);
          auVar43 = vpaddd_avx2(auVar7,auVar43);
          auVar43 = vpsrad_avx2(auVar43,ZEXT416(uVar4));
          auVar44 = vpslld_avx2(auVar9,ZEXT416(uVar29));
          auVar7 = vpslld_avx2(auVar43,ZEXT416(uVar29));
          auVar43 = vpunpckldq_avx2(auVar44,auVar7);
          auVar43 = vpaddd_avx2(auVar43,auVar36);
          if ((long)((ulong)(uint)w - 8) < (long)uVar21) {
            if (iVar26 == 0) {
              auVar43 = vpackusdw_avx2(auVar43,ZEXT432(uVar29));
              *(long *)((long)pCVar24 + lVar20) = auVar43._0_8_;
              *(long *)((long)pCVar25 + lVar20) = auVar43._16_8_;
            }
            else {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = *(ulong *)((long)pCVar25 + lVar20);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = *(ulong *)((long)pCVar24 + lVar20);
              auVar44._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar34;
              auVar44._16_16_ = ZEXT116(1) * auVar33;
              auVar44 = vpunpcklwd_avx2(auVar44,_DAT_00510fe0);
              if (iVar31 == 0) {
                auVar43 = vpaddd_avx2(auVar43,auVar44);
                auVar43 = vpsrad_avx2(auVar43,1);
              }
              else {
                auVar14._4_4_ = iVar1;
                auVar14._0_4_ = iVar1;
                auVar14._8_4_ = iVar1;
                auVar14._12_4_ = iVar1;
                auVar14._16_4_ = iVar1;
                auVar14._20_4_ = iVar1;
                auVar14._24_4_ = iVar1;
                auVar14._28_4_ = iVar1;
                auVar44 = vpmulld_avx2(auVar44,auVar14);
                auVar7._4_4_ = iVar2;
                auVar7._0_4_ = iVar2;
                auVar7._8_4_ = iVar2;
                auVar7._12_4_ = iVar2;
                auVar7._16_4_ = iVar2;
                auVar7._20_4_ = iVar2;
                auVar7._24_4_ = iVar2;
                auVar7._28_4_ = iVar2;
                auVar43 = vpmulld_avx2(auVar43,auVar7);
                auVar43 = vpaddd_avx2(auVar44,auVar43);
                auVar43 = vpsrad_avx2(auVar43,4);
              }
              auVar43 = vpaddd_avx2(auVar42,auVar43);
              auVar43 = vpsrad_avx2(auVar43,ZEXT416(uVar17));
              auVar43 = vpackusdw_avx2(auVar43,auVar43);
              auVar43 = vpminsw_avx2(auVar43,auVar37);
              *(long *)((long)puVar28 + lVar20) = auVar43._0_8_;
              *(long *)((long)puVar23 + lVar20) = auVar43._16_8_;
            }
          }
          else {
            auVar44 = vpunpckhdq_avx2(auVar44,auVar7);
            auVar44 = vpaddd_avx2(auVar44,auVar36);
            if (iVar26 == 0) {
              auVar43 = vpackusdw_avx2(auVar43,auVar44);
              *(undefined1 (*) [16])((long)pCVar24 + lVar20) = auVar43._0_16_;
              *(undefined1 (*) [16])((long)pCVar25 + lVar20) = auVar43._16_16_;
            }
            else {
              auVar45._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])((long)pCVar25 + lVar20) +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar24 + lVar20);
              auVar45._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar25 + lVar20);
              auVar7 = vpunpcklwd_avx2(auVar45,_DAT_00510fe0);
              if (iVar31 == 0) {
                auVar43 = vpaddd_avx2(auVar43,auVar7);
                auVar43 = vpsrad_avx2(auVar43,1);
              }
              else {
                auVar9._4_4_ = iVar1;
                auVar9._0_4_ = iVar1;
                auVar9._8_4_ = iVar1;
                auVar9._12_4_ = iVar1;
                auVar9._16_4_ = iVar1;
                auVar9._20_4_ = iVar1;
                auVar9._24_4_ = iVar1;
                auVar9._28_4_ = iVar1;
                auVar7 = vpmulld_avx2(auVar7,auVar9);
                auVar8._4_4_ = iVar2;
                auVar8._0_4_ = iVar2;
                auVar8._8_4_ = iVar2;
                auVar8._12_4_ = iVar2;
                auVar8._16_4_ = iVar2;
                auVar8._20_4_ = iVar2;
                auVar8._24_4_ = iVar2;
                auVar8._28_4_ = iVar2;
                auVar43 = vpmulld_avx2(auVar43,auVar8);
                auVar43 = vpaddd_avx2(auVar7,auVar43);
                auVar43 = vpsrad_avx2(auVar43,4);
              }
              auVar7 = vpunpckhwd_avx2(auVar45,_DAT_00510fe0);
              if (iVar31 == 0) {
                auVar44 = vpaddd_avx2(auVar44,auVar7);
                auVar44 = vpsrad_avx2(auVar44,1);
              }
              else {
                auVar11._4_4_ = iVar1;
                auVar11._0_4_ = iVar1;
                auVar11._8_4_ = iVar1;
                auVar11._12_4_ = iVar1;
                auVar11._16_4_ = iVar1;
                auVar11._20_4_ = iVar1;
                auVar11._24_4_ = iVar1;
                auVar11._28_4_ = iVar1;
                auVar7 = vpmulld_avx2(auVar7,auVar11);
                auVar10._4_4_ = iVar2;
                auVar10._0_4_ = iVar2;
                auVar10._8_4_ = iVar2;
                auVar10._12_4_ = iVar2;
                auVar10._16_4_ = iVar2;
                auVar10._20_4_ = iVar2;
                auVar10._24_4_ = iVar2;
                auVar10._28_4_ = iVar2;
                auVar44 = vpmulld_avx2(auVar44,auVar10);
                auVar44 = vpaddd_avx2(auVar7,auVar44);
                auVar44 = vpsrad_avx2(auVar44,4);
              }
              auVar43 = vpaddd_avx2(auVar42,auVar43);
              auVar7 = vpsrad_avx2(auVar43,ZEXT416(uVar17));
              auVar43 = vpaddd_avx2(auVar42,auVar44);
              auVar43 = vpsrad_avx2(auVar43,ZEXT416(uVar17));
              auVar43 = vpackusdw_avx2(auVar7,auVar43);
              auVar43 = vpminsw_avx2(auVar43,auVar37);
              *(undefined1 (*) [16])((long)puVar28 + lVar20) = auVar43._0_16_;
              *(undefined1 (*) [16])((long)puVar23 + lVar20) = auVar43._16_16_;
            }
          }
          lVar18 = lVar18 + 2;
          lVar32 = lVar32 + lVar22 * 4;
          pCVar25 = pCVar25 + lVar27 * 2;
          pCVar24 = pCVar24 + lVar27 * 2;
          puVar23 = puVar23 + lVar16 * 2;
          puVar28 = puVar28 + lVar16 * 2;
          puVar30 = puVar30 + lVar22 * 2;
        } while (lVar18 < h);
      }
      uVar21 = uVar21 + 8;
      lVar20 = lVar20 + 0x10;
    } while (uVar21 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;

  int i, j;
  __m256i s[4], coeffs_x[4];

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i round_const_x =
      _mm256_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits >= 0);
  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 2) {
      const __m256i row0 =
          _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
      __m256i row1 =
          _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

      const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
      const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

      // even pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 0);
      s[1] = _mm256_alignr_epi8(r1, r0, 4);
      s[2] = _mm256_alignr_epi8(r1, r0, 8);
      s[3] = _mm256_alignr_epi8(r1, r0, 12);

      __m256i res_even = convolve(s, coeffs_x);
      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                  round_shift_x);

      // odd pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 2);
      s[1] = _mm256_alignr_epi8(r1, r0, 6);
      s[2] = _mm256_alignr_epi8(r1, r0, 10);
      s[3] = _mm256_alignr_epi8(r1, r0, 14);

      __m256i res_odd = convolve(s, coeffs_x);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                 round_shift_x);

      res_even = _mm256_sll_epi32(res_even, round_shift_bits);
      res_odd = _mm256_sll_epi32(res_odd, round_shift_bits);

      __m256i res1 = _mm256_unpacklo_epi32(res_even, res_odd);

      __m256i res_unsigned_lo = _mm256_add_epi32(res1, offset_const);

      if (w - j < 8) {
        if (do_average) {
          const __m256i data_0 = _mm256_castsi128_si256(
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
          const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
          const __m256i data_01 =
              _mm256_permute2x128_si256(data_0, data_1, 0x20);

          const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

          const __m256i comp_avg_res = highbd_comp_avg(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);

          const __m256i round_result = highbd_convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result, round_result);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_0 = _mm256_castsi256_si128(res_clip);
          const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
          _mm_storel_epi64(
              (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
        } else {
          __m256i res_16b =
              _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
          const __m128i res_0 = _mm256_castsi256_si128(res_16b);
          const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                           res_1);
        }
      } else {
        __m256i res2 = _mm256_unpackhi_epi32(res_even, res_odd);
        __m256i res_unsigned_hi = _mm256_add_epi32(res2, offset_const);

        if (do_average) {
          const __m256i data_0 = _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
          const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
          const __m256i data_01 =
              _mm256_permute2x128_si256(data_0, data_1, 0x20);

          const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
          const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

          const __m256i comp_avg_res_lo =
              highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                              use_dist_wtd_comp_avg);
          const __m256i comp_avg_res_hi =
              highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i round_result_lo = highbd_convolve_rounding(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m256i round_result_hi = highbd_convolve_rounding(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result_lo, round_result_hi);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_0 = _mm256_castsi256_si128(res_clip);
          const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                          res_1);
        } else {
          __m256i res_16b =
              _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
          const __m128i res_0 = _mm256_castsi256_si128(res_16b);
          const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  }
}